

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_tests.cpp
# Opt level: O0

void __thiscall base64_tests::base64_testvectors::test_method(base64_testvectors *this)

{
  string_view str;
  Span<const_std::byte> input;
  string_view str_00;
  initializer_list<unsigned_char> __l;
  initializer_list<std::byte> __l_00;
  Span<const_unsigned_char> input_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  long in_FS_OFFSET;
  uint i;
  vector<std::byte,_std::allocator<std::byte>_> in_b;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_u;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> dec;
  string out_exp;
  string in_s;
  string strEnc;
  char *in_stack_fffffffffffff648;
  string *in_stack_fffffffffffff650;
  char *in_stack_fffffffffffff658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff668;
  const_string *in_stack_fffffffffffff670;
  const_string *msg;
  char *in_stack_fffffffffffff678;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffff680;
  const_string *file;
  allocator<char> *in_stack_fffffffffffff688;
  iterator in_stack_fffffffffffff690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff698;
  uchar *in_stack_fffffffffffff6a0;
  size_t in_stack_fffffffffffff6a8;
  size_t in_stack_fffffffffffff6c0;
  const_string *pcVar6;
  char *in_stack_fffffffffffff6c8;
  char *pcVar7;
  uint local_690;
  const_string local_660 [2];
  lazy_ostream local_640 [2];
  assertion_result local_620;
  const_string local_608;
  undefined1 local_5f8 [16];
  const_string local_5e8 [2];
  lazy_ostream local_5c8 [2];
  assertion_result local_5a8 [2];
  const_string local_570 [2];
  lazy_ostream local_550 [2];
  assertion_result local_530;
  char local_508 [16];
  const_string local_4f8 [2];
  lazy_ostream local_4d8 [2];
  assertion_result local_4b8 [2];
  undefined1 local_480 [16];
  undefined1 local_470 [80];
  undefined1 local_420 [16];
  undefined1 local_410 [80];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [69];
  allocator<char> local_36b;
  allocator<char> local_36a [58];
  const_string local_330;
  lazy_ostream local_320 [2];
  assertion_result local_300 [2];
  const_string local_2c8 [2];
  lazy_ostream local_2a8 [2];
  assertion_result local_288 [2];
  undefined1 local_250 [16];
  undefined1 local_240 [66];
  allocator<char> local_1fe;
  allocator<char> local_1fd;
  allocator<char> local_1fc;
  allocator<char> local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  allocator<char> local_1f8;
  allocator<char> local_1f7;
  allocator<char> local_1f6;
  allocator<char> local_1f5;
  allocator<char> local_1f4;
  allocator<char> local_1f3;
  allocator<char> local_1f2;
  allocator<char> local_1f1 [131];
  undefined1 local_16e;
  undefined1 local_16d;
  undefined1 local_16c;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  allocator<char> local_148 [128];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  string local_68 [2];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((test_method()::vstrIn_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&test_method()::vstrIn_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::~allocator(&local_1f7);
    std::allocator<char>::~allocator(&local_1f6);
    std::allocator<char>::~allocator(&local_1f5);
    std::allocator<char>::~allocator(&local_1f4);
    std::allocator<char>::~allocator(&local_1f3);
    std::allocator<char>::~allocator(&local_1f2);
    std::allocator<char>::~allocator(local_1f1);
    __cxa_atexit(::__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&test_method()::vstrIn_abi_cxx11_);
  }
  if ((test_method()::vstrOut_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&test_method()::vstrOut_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688
              );
    std::allocator<char>::~allocator(&local_1fe);
    std::allocator<char>::~allocator(&local_1fd);
    std::allocator<char>::~allocator(&local_1fc);
    std::allocator<char>::~allocator(&local_1fb);
    std::allocator<char>::~allocator(&local_1fa);
    std::allocator<char>::~allocator(&local_1f9);
    std::allocator<char>::~allocator(&local_1f8);
    __cxa_atexit(__cxx_global_array_dtor_19,0,&__dso_handle);
    __cxa_guard_release(&test_method()::vstrOut_abi_cxx11_);
  }
  local_690 = 0;
  while( true ) {
    uVar3 = (ulong)local_690;
    sVar4 = std::size<std::__cxx11::string,7ul>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> (*) [7])
                       in_stack_fffffffffffff648);
    if (sVar4 <= uVar3) break;
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff668);
    str._M_str = in_stack_fffffffffffff678;
    str._M_len = (size_t)in_stack_fffffffffffff670;
    EncodeBase64_abi_cxx11_(str);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
                 (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                 (size_t)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff650,(char (*) [1])in_stack_fffffffffffff648);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
                 (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
      in_stack_fffffffffffff650 = test_method()::vstrOut_abi_cxx11_ + local_690;
      in_stack_fffffffffffff658 = "vstrOut[i]";
      in_stack_fffffffffffff648 = "strEnc";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_240,local_250,0x17,1,2,local_28);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff648);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff668);
    str_01._M_str = in_stack_fffffffffffff6c8;
    str_01._M_len = in_stack_fffffffffffff6c0;
    DecodeBase64(str_01);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
                 (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                 (size_t)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
      boost::test_tools::assertion_result::
      assertion_result<std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((assertion_result *)in_stack_fffffffffffff658,
                 (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 in_stack_fffffffffffff650);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
                 (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff650,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff648);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
                 (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
      in_stack_fffffffffffff648 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_288,local_2a8,local_2c8,0x19,REQUIRE,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff648);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff648);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
                 (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                 (size_t)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
      pvVar5 = std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator*
                         ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                          in_stack_fffffffffffff648);
      std::ranges::__equal_fn::
      operator()<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                ((__equal_fn *)&std::ranges::equal,pvVar5,
                 test_method()::vstrIn_abi_cxx11_ + local_690);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff658,
                 SUB81((ulong)in_stack_fffffffffffff650 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff650,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff648);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
                 (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
      in_stack_fffffffffffff648 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_300,local_320,&local_330,0x1a,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff648);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff648);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffff648);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff648);
    local_690 = local_690 + 1;
  }
  local_16b = 0xff;
  local_16a = 1;
  local_169 = 0xff;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff648);
  __l._M_len = (size_type)in_stack_fffffffffffff698;
  __l._M_array = in_stack_fffffffffffff690;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff688,__l,
             (allocator_type *)in_stack_fffffffffffff680);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff648);
  local_16e = 0xff;
  local_16d = 1;
  local_16c = 0xff;
  std::allocator<std::byte>::allocator((allocator<std::byte> *)in_stack_fffffffffffff648);
  __l_00._M_len = (size_type)in_stack_fffffffffffff698;
  __l_00._M_array = in_stack_fffffffffffff690;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff688,__l_00,
             (allocator_type *)in_stack_fffffffffffff680);
  std::allocator<std::byte>::~allocator((allocator<std::byte> *)in_stack_fffffffffffff648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::allocator<char>::~allocator(local_36a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff698,(char *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
  std::allocator<char>::~allocator(&local_36b);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
               (size_t)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,(char (*) [1])in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff658,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff650,
               in_stack_fffffffffffff648);
    input_00.m_size = in_stack_fffffffffffff6a8;
    input_00.m_data = in_stack_fffffffffffff6a0;
    EncodeBase64_abi_cxx11_(input_00);
    in_stack_fffffffffffff658 = "out_exp";
    in_stack_fffffffffffff650 = local_68;
    in_stack_fffffffffffff648 = "EncodeBase64(in_u)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_3b0,local_3c0,0x22,1,2,local_88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff648);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
               (size_t)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,(char (*) [1])in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
              ((Span<const_std::byte> *)in_stack_fffffffffffff658,
               (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff650,
               in_stack_fffffffffffff648);
    input.m_size = (size_t)in_stack_fffffffffffff678;
    input.m_data = (byte *)in_stack_fffffffffffff670;
    EncodeBase64_abi_cxx11_(input);
    in_stack_fffffffffffff658 = "out_exp";
    in_stack_fffffffffffff650 = local_68;
    in_stack_fffffffffffff648 = "EncodeBase64(in_b)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_410,local_420,0x23,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff648);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
               (size_t)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,(char (*) [1])in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff668);
    str_00._M_str = in_stack_fffffffffffff678;
    str_00._M_len = (size_t)in_stack_fffffffffffff670;
    EncodeBase64_abi_cxx11_(str_00);
    in_stack_fffffffffffff658 = "out_exp";
    in_stack_fffffffffffff650 = local_68;
    in_stack_fffffffffffff648 = "EncodeBase64(in_s)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_470,local_480,0x24,1,2,local_c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff648);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff648);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff648);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff658);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff658);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
               (size_t)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
    s_abi_cxx11_((char *)in_stack_fffffffffffff688,(size_t)in_stack_fffffffffffff680);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff668);
    str_02._M_str = in_stack_fffffffffffff6c8;
    str_02._M_len = in_stack_fffffffffffff6c0;
    DecodeBase64(str_02);
    std::optional::operator_cast_to_bool
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff658,
               SUB81((ulong)in_stack_fffffffffffff650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,
               (basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    in_stack_fffffffffffff648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4b8,local_4d8,local_4f8,0x28,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff648);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffff648);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pcVar7 = local_508;
    pcVar6 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
               (size_t)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
    s_abi_cxx11_((char *)in_stack_fffffffffffff688,(size_t)in_stack_fffffffffffff680);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff668);
    str_03._M_str = pcVar7;
    str_03._M_len = (size_t)pcVar6;
    DecodeBase64(str_03);
    boost::test_tools::assertion_result::
    assertion_result<std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((assertion_result *)in_stack_fffffffffffff658,
               (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffff650);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,
               (basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    in_stack_fffffffffffff648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_530,local_550,local_570,0x29,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff648);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffff648);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
               (size_t)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
    s_abi_cxx11_((char *)in_stack_fffffffffffff688,(size_t)in_stack_fffffffffffff680);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff668);
    str_04._M_str = pcVar7;
    str_04._M_len = (size_t)pcVar6;
    DecodeBase64(str_04);
    std::optional::operator_cast_to_bool
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff658,
               SUB81((ulong)in_stack_fffffffffffff650 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,
               (basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    in_stack_fffffffffffff648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5a8,local_5c8,local_5e8,0x2a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff648);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffff648);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    line_num = local_5f8;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    file = &local_608;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff688,file,(size_t)line_num,msg);
    in_stack_fffffffffffff688 = local_148;
    s_abi_cxx11_((char *)in_stack_fffffffffffff688,(size_t)file);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff668);
    str_05._M_str = pcVar7;
    str_05._M_len = (size_t)pcVar6;
    DecodeBase64(str_05);
    std::optional::operator_cast_to_bool
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff658,
               SUB81((ulong)in_stack_fffffffffffff650 >> 0x38,0));
    in_stack_fffffffffffff668 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff650,
               (basic_cstring<const_char> *)in_stack_fffffffffffff648);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff658,
               (pointer)in_stack_fffffffffffff650,(unsigned_long)in_stack_fffffffffffff648);
    in_stack_fffffffffffff648 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_620,local_640,local_660,0x2b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff648);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff648);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffff648);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff648);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(base64_testvectors)
{
    static const std::string vstrIn[]  = {"","f","fo","foo","foob","fooba","foobar"};
    static const std::string vstrOut[] = {"","Zg==","Zm8=","Zm9v","Zm9vYg==","Zm9vYmE=","Zm9vYmFy"};
    for (unsigned int i=0; i<std::size(vstrIn); i++)
    {
        std::string strEnc = EncodeBase64(vstrIn[i]);
        BOOST_CHECK_EQUAL(strEnc, vstrOut[i]);
        auto dec = DecodeBase64(strEnc);
        BOOST_REQUIRE(dec);
        BOOST_CHECK_MESSAGE(std::ranges::equal(*dec, vstrIn[i]), vstrOut[i]);
    }

    {
        const std::vector<uint8_t> in_u{0xff, 0x01, 0xff};
        const std::vector<std::byte> in_b{std::byte{0xff}, std::byte{0x01}, std::byte{0xff}};
        const std::string in_s{"\xff\x01\xff"};
        const std::string out_exp{"/wH/"};
        BOOST_CHECK_EQUAL(EncodeBase64(in_u), out_exp);
        BOOST_CHECK_EQUAL(EncodeBase64(in_b), out_exp);
        BOOST_CHECK_EQUAL(EncodeBase64(in_s), out_exp);
    }

    // Decoding strings with embedded NUL characters should fail
    BOOST_CHECK(!DecodeBase64("invalid\0"s));
    BOOST_CHECK(DecodeBase64("nQB/pZw="s));
    BOOST_CHECK(!DecodeBase64("nQB/pZw=\0invalid"s));
    BOOST_CHECK(!DecodeBase64("nQB/pZw=invalid\0"s));
}